

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::scroll_(Fl_Text_Display *this,int topLineNum,int horizOffset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int newTopLineNum;
  
  iVar3 = (this->mNBufferLines - this->mNVisibleLines) + 3;
  if (topLineNum <= iVar3) {
    iVar3 = topLineNum;
  }
  newTopLineNum = 1;
  if (1 < iVar3) {
    newTopLineNum = iVar3;
  }
  if (this->mNVisibleLines < 1) {
    iVar3 = (this->text_area).w;
    if (horizOffset <= -iVar3) goto LAB_001d1dac;
LAB_001d1da8:
    iVar1 = 0;
  }
  else {
    iVar3 = 0;
    iVar1 = 0;
    do {
      iVar2 = measure_vline(this,iVar3);
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = iVar2;
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->mNVisibleLines);
    iVar3 = (this->text_area).w;
    if (horizOffset <= iVar1 - iVar3) goto LAB_001d1dac;
    if (this->mNVisibleLines < 1) goto LAB_001d1da8;
    iVar3 = 0;
    iVar1 = 0;
    do {
      iVar2 = measure_vline(this,iVar3);
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = iVar2;
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->mNVisibleLines);
    iVar3 = (this->text_area).w;
  }
  horizOffset = iVar1 - iVar3;
LAB_001d1dac:
  iVar3 = 0;
  if (horizOffset < 1) {
    horizOffset = 0;
  }
  if ((this->mHorizOffset != horizOffset) || (this->mTopLineNum != newTopLineNum)) {
    offset_line_starts(this,newTopLineNum);
    this->mHorizOffset = horizOffset;
    Fl_Widget::damage((Fl_Widget *)this,'\x02');
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Fl_Text_Display::scroll_(int topLineNum, int horizOffset) {
  /* Limit the requested scroll position to allowable values */
  if (topLineNum > mNBufferLines + 3 - mNVisibleLines)
    topLineNum = mNBufferLines + 3 - mNVisibleLines;
  if (topLineNum < 1) topLineNum = 1;

  if (horizOffset > longest_vline() - text_area.w)
    horizOffset = longest_vline() - text_area.w;
  if (horizOffset < 0) horizOffset = 0;

  /* Do nothing if scroll position hasn't actually changed or there's no
   window to draw in yet */
  if (mHorizOffset == horizOffset && mTopLineNum == topLineNum)
    return 0;

  /* If the vertical scroll position has changed, update the line
   starts array and related counters in the text display */
  offset_line_starts(topLineNum);

  /* Just setting mHorizOffset is enough information for redisplay */
  mHorizOffset = horizOffset;

  // redraw all text
  damage(FL_DAMAGE_EXPOSE);
  return 1;
}